

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

string_view __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpBase::GetSymbolName
          (BinaryReaderObjdumpBase *this,Index symbol_index)

{
  ObjdumpState *pOVar1;
  pointer pOVar2;
  ulong uVar3;
  string_view sVar4;
  Index index;
  ulong uVar5;
  ObjdumpNames *this_00;
  string_view sVar6;
  
  uVar3 = (ulong)symbol_index;
  pOVar1 = this->objdump_state_;
  pOVar2 = (pOVar1->symtab).
           super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = ((long)(pOVar1->symtab).
                 super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
          -0x5555555555555555;
  if (uVar5 < uVar3 || uVar5 - uVar3 == 0) {
    sVar6._M_str = "<illegal_symbol_index>";
    sVar6._M_len = 0x16;
  }
  else {
    switch(pOVar2[uVar3].kind) {
    case Function:
      index = pOVar2[uVar3].index;
      this_00 = &pOVar1->function_names;
      break;
    case Data:
      sVar4._M_str = pOVar2[uVar3].name._M_dataplus._M_p;
      sVar4._M_len = pOVar2[uVar3].name._M_string_length;
      return sVar4;
    case Global:
      index = pOVar2[uVar3].index;
      this_00 = &pOVar1->global_names;
      break;
    case Section:
      index = pOVar2[uVar3].index;
      this_00 = &pOVar1->section_names;
      break;
    case Tag:
      index = pOVar2[uVar3].index;
      this_00 = &pOVar1->tag_names;
      break;
    case Table:
      index = pOVar2[uVar3].index;
      this_00 = &pOVar1->table_names;
      break;
    default:
      abort();
    }
    sVar6 = ObjdumpNames::Get(this_00,index);
  }
  return sVar6;
}

Assistant:

std::string_view BinaryReaderObjdumpBase::GetSymbolName(
    Index symbol_index) const {
  if (symbol_index >= objdump_state_->symtab.size())
    return "<illegal_symbol_index>";
  ObjdumpSymbol& sym = objdump_state_->symtab[symbol_index];
  switch (sym.kind) {
    case SymbolType::Function:
      return GetFunctionName(sym.index);
    case SymbolType::Data:
      return sym.name;
    case SymbolType::Global:
      return GetGlobalName(sym.index);
    case SymbolType::Section:
      return GetSectionName(sym.index);
    case SymbolType::Tag:
      return GetTagName(sym.index);
    case SymbolType::Table:
      return GetTableName(sym.index);
  }
  WABT_UNREACHABLE;
}